

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Value::Which,capnp::schema::Value::Which&>&,char_const(&)[26],unsigned_int,unsigned_int>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<capnp::schema::Value::Which,_capnp::schema::Value::Which_&> *params,
          char (*params_1) [26],uint *params_2,uint *params_3)

{
  undefined4 in_register_00000014;
  char (*params_00) [26];
  uint *params_01;
  uint *params_02;
  ArrayDisposer **local_100;
  undefined1 local_98 [8];
  String argValues [4];
  char *macroArgs_local;
  char *condition_local;
  Type code_local;
  int line_local;
  char *file_local;
  Fault *this_local;
  
  this->exception = (Exception *)0x0;
  str<kj::_::DebugComparison<capnp::schema::Value::Which,capnp::schema::Value::Which&>&>
            ((String *)local_98,(kj *)params,
             (DebugComparison<capnp::schema::Value::Which,_capnp::schema::Value::Which_&> *)
             CONCAT44(in_register_00000014,line));
  str<char_const(&)[26]>((String *)&argValues[0].content.disposer,(kj *)params_1,params_00);
  str<unsigned_int&>((String *)&argValues[1].content.disposer,(kj *)params_2,params_01);
  str<unsigned_int&>((String *)&argValues[2].content.disposer,(kj *)params_3,params_02);
  arrayPtr<kj::String>((String *)local_98,4);
  init(this,(EVP_PKEY_CTX *)file);
  local_100 = &argValues[3].content.disposer;
  do {
    local_100 = local_100 + -3;
    String::~String((String *)local_100);
  } while (local_100 != (ArrayDisposer **)local_98);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}